

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::fragment_sections::end_object(fragment_sections *this)

{
  context *pcVar1;
  transaction_base *transaction;
  pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  last;
  uint128 *puVar2;
  uint uVar3;
  long lVar4;
  _Type this_00;
  long lVar5;
  __normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  first;
  error_code eVar7;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragment_index;
  extent<pstore::repo::fragment> fext;
  undefined1 local_148 [24];
  unsigned_long auStack_130 [1];
  pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
  local_128;
  error_category *peVar6;
  
  pcVar1 = (this->super_rule).context_.ptr_;
  transaction = (this->transaction_).ptr_;
  if ((pcVar1->db).ptr_ != transaction->db_) {
    assert_failed("ctxt->db == &transaction_->db ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/import_fragment.cpp"
                  ,0xa5);
  }
  first._M_current =
       (this->dispatchers_).
       super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  last.it_._M_current =
       (__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
        )(this->dispatchers_).
         super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  fext = repo::fragment::
         alloc<pstore::transaction_base,pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
                   (transaction,
                    (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                     )first._M_current,last);
  repo::fragment::load((fragment *)local_148,(pcVar1->db).ptr_,&fext);
  eVar7 = check_fragment((fragment *)local_148._0_8_);
  peVar6 = eVar7._M_cat;
  uVar3 = eVar7._M_value;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  if (uVar3 != 0) goto LAB_0012097b;
  index::
  get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&fragment_index,(pcVar1->db).ptr_,true);
  puVar2 = (this->digest_).ptr_;
  local_148._0_8_ = *(undefined8 *)&puVar2->v_;
  local_148._8_8_ = *(uint64_t *)((long)&puVar2->v_ + 8);
  local_148._16_8_ = fext.addr.a_.a_;
  auStack_130[0] = fext.size;
  index::
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  ::insert<pstore::uint128,pstore::extent<pstore::repo::fragment>,void>
            (&local_128,
             (hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
              *)fragment_index.
                super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,(this->transaction_).ptr_,
             (pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *)local_148);
  std::
  unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
  ::~unique_ptr(&local_128.first.pos_);
  lVar4 = (long)last.it_._M_current - (long)first._M_current;
  for (lVar5 = lVar4 >> 5; 0 < lVar5; lVar5 = lVar5 + -1) {
    if ((((first._M_current)->_M_t).
         super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl)->
        kind_ == linked_definitions) goto LAB_00120930;
    if ((first._M_current[1]._M_t.
         super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl)->
        kind_ == linked_definitions) {
      first._M_current = first._M_current + 1;
      goto LAB_00120930;
    }
    if ((first._M_current[2]._M_t.
         super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl)->
        kind_ == linked_definitions) {
      first._M_current = first._M_current + 2;
      goto LAB_00120930;
    }
    if ((first._M_current[3]._M_t.
         super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl)->
        kind_ == linked_definitions) {
      first._M_current = first._M_current + 3;
      goto LAB_00120930;
    }
    first._M_current = first._M_current + 4;
    lVar4 = lVar4 + -0x20;
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 == 1) {
LAB_00120913:
    if ((((first._M_current)->_M_t).
         super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl)->
        kind_ != linked_definitions) {
      first._M_current =
           (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
            *)last.it_._M_current;
    }
LAB_00120930:
    if ((__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
         )first._M_current != last.it_._M_current) {
      this_00 = (_Type)operator_new(0x20);
      address_patch::address_patch((address_patch *)this_00,(pcVar1->db).ptr_,&fext);
      local_148._0_8_ = this_00;
      std::__cxx11::
      list<std::unique_ptr<pstore::exchange::import_ns::patcher,std::default_delete<pstore::exchange::import_ns::patcher>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,std::default_delete<pstore::exchange::import_ns::patcher>>>>
      ::emplace_back<pstore::exchange::import_ns::address_patch*>
                ((list<std::unique_ptr<pstore::exchange::import_ns::patcher,std::default_delete<pstore::exchange::import_ns::patcher>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,std::default_delete<pstore::exchange::import_ns::patcher>>>>
                  *)&pcVar1->patches,(address_patch **)local_148);
    }
  }
  else {
    if (lVar4 == 2) {
LAB_00120906:
      if ((((first._M_current)->_M_t).
           super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
           .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl)
          ->kind_ != linked_definitions) {
        first._M_current = first._M_current + 1;
        goto LAB_00120913;
      }
      goto LAB_00120930;
    }
    if (lVar4 == 3) {
      if ((((first._M_current)->_M_t).
           super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
           .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl)
          ->kind_ != linked_definitions) {
        first._M_current = first._M_current + 1;
        goto LAB_00120906;
      }
      goto LAB_00120930;
    }
  }
  eVar7 = rule::pop(&this->super_rule);
  peVar6 = eVar7._M_cat;
  uVar3 = eVar7._M_value;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fragment_index.
              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
LAB_0012097b:
  eVar7._4_4_ = 0;
  eVar7._M_value = uVar3;
  eVar7._M_cat = peVar6;
  return eVar7;
}

Assistant:

std::error_code fragment_sections::end_object () {
                context * const ctxt = this->get_context ();
                PSTORE_ASSERT (ctxt->db == &transaction_->db ());

                auto const dispatchers_begin = make_pointee_adaptor (dispatchers_.begin ());
                auto const dispatchers_end = make_pointee_adaptor (dispatchers_.end ());
                auto const fext =
                    repo::fragment::alloc (*transaction_, dispatchers_begin, dispatchers_end);

                // Check that the fragment is legal before we go further.
                if (std::error_code const error =
                        this->check_fragment (*repo::fragment::load (*ctxt->db, fext))) {
                    return error;
                }
                auto const fragment_index =
                    index::get_index<trailer::indices::fragment> (*ctxt->db, true /* create */);
                fragment_index->insert (*transaction_, std::make_pair (*digest_, fext));

                // If this fragment has a linked-definitions section then we need to patch the
                // addresses of the referenced definitions one we've imported everything.
                if (std::find_if (dispatchers_begin, dispatchers_end,
                                  [] (repo::section_creation_dispatcher const & d) {
                                      return d.kind () == repo::section_kind::linked_definitions;
                                  }) != dispatchers_end) {
                    ctxt->patches.emplace_back (new address_patch (ctxt->db, fext));
                }
                return pop ();
            }